

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# size.h
# Opt level: O3

Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *
gimage::medianDownscaleImage<unsigned_short>
          (Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *__return_storage_ptr__,
          Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *image,int factor)

{
  unsigned_short ***pppuVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  __last;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  vector<unsigned_short,_std::allocator<unsigned_short>_> v;
  value_type_conflict3 local_74;
  allocator_type local_71;
  ulong local_70;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *local_68;
  ulong local_60;
  __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  local_58;
  ulong local_50;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_48;
  
  uVar12 = 1;
  if (1 < factor) {
    uVar12 = (ulong)(uint)factor;
  }
  lVar2 = image->width;
  lVar11 = image->height;
  iVar3 = image->depth;
  __return_storage_ptr__->depth = 0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  __return_storage_ptr__->n = 0;
  __return_storage_ptr__->pixel = (unsigned_short *)0x0;
  __return_storage_ptr__->row = (unsigned_short **)0x0;
  __return_storage_ptr__->img = (unsigned_short ***)0x0;
  local_68 = __return_storage_ptr__;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::setSize
            (__return_storage_ptr__,(long)(lVar2 + (uVar12 - 1)) / (long)uVar12,
             (long)((uVar12 - 1) + lVar11) / (long)uVar12,(long)iVar3);
  local_74 = 0;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            (&local_48,(ulong)(uint)((int)uVar12 * (int)uVar12),&local_74,&local_71);
  iVar3 = image->depth;
  if (0 < iVar3) {
    lVar2 = image->height;
    lVar11 = 0;
    do {
      if (0 < lVar2) {
        lVar4 = image->width;
        local_70 = 0;
        do {
          if (0 < lVar4) {
            local_60 = local_70 / uVar12;
            uVar6 = 0;
            do {
              lVar2 = image->height;
              uVar5 = 0;
              uVar10 = 0;
              do {
                if (lVar2 <= (long)(local_70 + uVar5)) break;
                pppuVar1 = image->img;
                uVar10 = (ulong)(int)uVar10;
                uVar7 = uVar12;
                uVar8 = uVar6;
                do {
                  if (lVar4 <= (long)uVar8) break;
                  local_48.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar10] =
                       pppuVar1[lVar11][local_70 + uVar5][uVar8];
                  uVar10 = uVar10 + 1;
                  uVar8 = uVar8 + 1;
                  uVar7 = uVar7 - 1;
                } while (uVar7 != 0);
                uVar5 = uVar5 + 1;
              } while (uVar5 != uVar12);
              local_50 = uVar6 / uVar12;
              local_68->img[lVar11][local_60][local_50] = 0;
              uVar9 = (uint)uVar10;
              if (0 < (int)uVar9) {
                __last._M_current =
                     (unsigned_short *)
                     ((ulong)(uVar9 & 0xfffffffe) +
                     (long)local_48.
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_start);
                local_58._M_current =
                     local_48.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                     _M_impl.super__Vector_impl_data._M_start;
                std::
                __heap_select<__gnu_cxx::__normal_iterator<unsigned_short*,std::vector<unsigned_short,std::allocator<unsigned_short>>>,__gnu_cxx::__ops::_Iter_less_iter>
                          (local_48.
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_start,__last._M_current,
                           local_48.
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_start + (uVar10 & 0xffffffff));
                std::
                __sort_heap<__gnu_cxx::__normal_iterator<unsigned_short*,std::vector<unsigned_short,std::allocator<unsigned_short>>>,__gnu_cxx::__ops::_Iter_less_iter>
                          (local_58,__last,(_Iter_less_iter *)&local_74);
                local_68->img[lVar11][local_60][local_50] =
                     local_48.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar9 >> 1];
                lVar4 = image->width;
              }
              uVar6 = uVar6 + uVar12;
            } while ((long)uVar6 < lVar4);
            lVar2 = image->height;
          }
          local_70 = local_70 + uVar12;
        } while ((long)local_70 < lVar2);
        iVar3 = image->depth;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < iVar3);
  }
  if (local_48.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (unsigned_short *)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return local_68;
}

Assistant:

Image<T> medianDownscaleImage(const Image<T> &image, int factor)
{
  factor=std::max(1, factor);

  Image<T> ret((image.getWidth()+factor-1)/factor,
               (image.getHeight()+factor-1)/factor, image.getDepth());

  std::vector<T> v(factor*factor, 0);

  for (int d=0; d<image.getDepth(); d++)
  {
    for (long k=0; k<image.getHeight(); k+=factor)
    {
      for (long i=0; i<image.getWidth(); i+=factor)
      {
        int n=0;

        for (int kk=0; kk<factor && k+kk<image.getHeight(); kk++)
        {
          for (int ii=0; ii<factor && i+ii<image.getWidth(); ii++)
          {
            if (image.isValid(i+ii, k+kk))
            {
              v[n]=image.get(i+ii, k+kk, d);
              n++;
            }
          }
        }

        ret.setInvalid(i/factor, k/factor, d);

        if (n > 0)
        {
          partial_sort(v.begin(), v.begin()+(n>>1), v.begin()+n);
          ret.set(i/factor, k/factor, d, v[n>>1]);
        }
      }
    }
  }

  return ret;
}